

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

double __thiscall
HighsSparseMatrix::computeDot
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *array,HighsInt use_col)

{
  pointer piVar1;
  long lVar2;
  double dVar3;
  
  if (use_col < this->num_col_) {
    piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar3 = 0.0;
    for (lVar2 = (long)piVar1[use_col]; lVar2 < piVar1[(long)use_col + 1]; lVar2 = lVar2 + 1) {
      dVar3 = dVar3 + (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start
                      [(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar2]] *
                      (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar2];
    }
  }
  else {
    dVar3 = (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[use_col - this->num_col_];
  }
  return dVar3;
}

Assistant:

double HighsSparseMatrix::computeDot(const std::vector<double>& array,
                                     const HighsInt use_col) const {
  assert(this->isColwise());
  double result = 0;
  if (use_col < this->num_col_) {
    for (HighsInt iEl = this->start_[use_col]; iEl < this->start_[use_col + 1];
         iEl++)
      result += array[this->index_[iEl]] * this->value_[iEl];
  } else {
    result = array[use_col - this->num_col_];
  }
  return result;
}